

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_token.c
# Opt level: O3

simple_token * simple_token_new(unsigned_short type,size_t start,size_t len)

{
  simple_token *psVar1;
  
  psVar1 = (simple_token *)malloc(0x38);
  if (psVar1 != (simple_token *)0x0) {
    psVar1->type = type;
    psVar1->start = start;
    psVar1->len = len;
    psVar1->next = (simple_token *)0x0;
    psVar1->prev = (simple_token *)0x0;
    psVar1->child = (simple_token *)0x0;
    psVar1->tail = psVar1;
  }
  return psVar1;
}

Assistant:

simple_token * simple_token_new(
	unsigned short type,				//!< Type for new token
	size_t start,						//!< Starting offset for token
	size_t len							//!< Len of token
) {
	simple_token * t = malloc(sizeof(simple_token));

	if (t) {
		t->type = type;
		t->start = start;
		t->len = len;

		t->next = NULL;
		t->prev = NULL;
		t->child = NULL;

		t->tail = t;
	}

	return t;
}